

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.h
# Opt level: O0

Mode5InterrogatorBasicData * __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::operator=
          (Mode5InterrogatorBasicData *this,Mode5InterrogatorBasicData *param_1)

{
  undefined1 uVar1;
  KUINT16 KVar2;
  KUINT32 KVar3;
  Mode5InterrogatorBasicData *param_1_local;
  Mode5InterrogatorBasicData *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  Mode5InterrogatorStatus::operator=(&this->m_Status,&param_1->m_Status);
  uVar1 = param_1->field_0x19;
  KVar2 = param_1->m_ui16Padding1;
  KVar3 = param_1->m_ui32MsgFormats;
  this->m_ui8Padding = param_1->m_ui8Padding;
  this->field_0x19 = uVar1;
  this->m_ui16Padding1 = KVar2;
  this->m_ui32MsgFormats = KVar3;
  EntityIdentifier::operator=(&this->m_InterrogatedID,&param_1->m_InterrogatedID);
  this->m_ui16Padding2 = param_1->m_ui16Padding2;
  return this;
}

Assistant:

class KDIS_EXPORT Mode5InterrogatorBasicData : public DataTypeBase
{
protected:
	
	Mode5InterrogatorStatus m_Status;

	KUINT8 m_ui8Padding;

	KUINT16 m_ui16Padding1;

	KUINT32 m_ui32MsgFormats;

	EntityIdentifier m_InterrogatedID;

	KUINT16 m_ui16Padding2;

public:

    static const KUINT16 MODE_5_INTERROGATOR_BASIC_DATA_SIZE = 16; 

    Mode5InterrogatorBasicData();

	Mode5InterrogatorBasicData( const Mode5InterrogatorStatus & Status, KUINT32 FormatsPresent, const EntityIdentifier & ID );

	Mode5InterrogatorBasicData(KDataStream &stream) noexcept(false);

    virtual ~Mode5InterrogatorBasicData();

    //************************************
    // FullName:    KDIS::DATA_TYPE::Mode5InterrogatorBasicData::SetStatus
    //              KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetStatus	
    // Description: The Mode 5 Message Formats supported by this Mode 5 interrogator.
    // Parameter:   const InterrogatorStatus & S
    //************************************
	void SetStatus( const Mode5InterrogatorStatus & S );
	const Mode5InterrogatorStatus & GetStatus() const;
	Mode5InterrogatorStatus & GetStatus();

	//************************************
    // FullName:    KDIS::DATA_TYPE::Mode5InterrogatorBasicData::SetMessageFormatsPresent
    //              KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetMessageFormatsPresentBitSet	
	//              KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetMessageFormatsPresent
    // Description: The Mode 5 Message Formats supported by this Mode 5 interrogator.
	//              When a Mode 5 interrogator is in the Regeneration Mode, the included message 
	//              formats shall be either:
	//              1) Those that this Mode 5 interrogator is capableof supporting and could be sent 
	//              in a Mode 5 interrogation as indicated by the Message Formats Status field being
	//              set to Capability (0).
	//              2) Only the specific message formats associated with this Mode 5 interrogator�s 
	//              current active interrogation as indicated by the Message Formats Status field 
	//              being set to Active Interrogation (1).
	//              When a Mode 5 interrogator is in the Interactive Mode, the requirements specified in
	//              Interactive Basic Mode 5 IFF Data record are applicable.
	//              Each bit represents a specific message format: Not Present (0) and Present (1).
    // Parameter:   KUINT32 MFP, const std::bitset<32> & MFP
    //************************************
	void SetMessageFormatsPresent( KUINT32 MFP );
	void SetMessageFormatsPresent( const std::bitset<32> & MFP );
	const std::bitset<32> GetMessageFormatsPresentBitSet() const;
	KUINT32 GetMessageFormatsPresent();
	
	//************************************
    // FullName:    KDIS::DATA_TYPE::Mode5InterrogatorBasicData::SetInterrogatedEntityID
    //              KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetInterrogatedEntityID		
    // Description: The Entity ID of the entity to which an active interrogation is being
    //              directed. If there is no active interrogation, this field shall be set
	//              to NO_SPECIFIC_ENTITY. 
    // Parameter:   const EntityIdentifier & ID 
    //************************************
    void SetInterrogatedEntityID( const EntityIdentifier & ID );
    const EntityIdentifier & GetInterrogatedEntityID() const;
    EntityIdentifier & GetInterrogatedEntityID();

	//************************************
    // FullName:    KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetAsString
    // Description: Returns a string representation
    //              of the PDU.
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
	virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const Mode5InterrogatorBasicData & Value ) const;
    KBOOL operator != ( const Mode5InterrogatorBasicData & Value ) const;
}